

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlStreamCompAddStep(xmlStreamCompPtr comp,xmlChar *name,xmlChar *ns,int nodeType,int flags)

{
  int iVar1;
  xmlStreamStepPtr pxVar2;
  int newSize;
  xmlStreamStepPtr tmp;
  xmlStreamStepPtr cur;
  int flags_local;
  int nodeType_local;
  xmlChar *ns_local;
  xmlChar *name_local;
  xmlStreamCompPtr comp_local;
  
  if (comp->maxStep <= comp->nbStep) {
    iVar1 = xmlGrowCapacity(comp->maxStep,0x20,4,1000000000);
    if (iVar1 < 0) {
      return -1;
    }
    pxVar2 = (xmlStreamStepPtr)(*xmlRealloc)(comp->steps,(long)iVar1 << 5);
    if (pxVar2 == (xmlStreamStepPtr)0x0) {
      return -1;
    }
    comp->steps = pxVar2;
    comp->maxStep = iVar1;
  }
  iVar1 = comp->nbStep;
  comp->nbStep = iVar1 + 1;
  pxVar2 = comp->steps + iVar1;
  pxVar2->flags = flags;
  pxVar2->name = name;
  pxVar2->ns = ns;
  pxVar2->nodeType = nodeType;
  return comp->nbStep + -1;
}

Assistant:

static int
xmlStreamCompAddStep(xmlStreamCompPtr comp, const xmlChar *name,
                     const xmlChar *ns, int nodeType, int flags) {
    xmlStreamStepPtr cur;

    if (comp->nbStep >= comp->maxStep) {
        xmlStreamStepPtr tmp;
        int newSize;

        newSize = xmlGrowCapacity(comp->maxStep, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
        if (newSize < 0) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamComp: growCapacity failed\n");
	    return(-1);
        }
	cur = xmlRealloc(comp->steps, newSize * sizeof(tmp[0]));
	if (cur == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamComp: malloc failed\n");
	    return(-1);
	}
	comp->steps = cur;
        comp->maxStep = newSize;
    }
    cur = &comp->steps[comp->nbStep++];
    cur->flags = flags;
    cur->name = name;
    cur->ns = ns;
    cur->nodeType = nodeType;
    return(comp->nbStep - 1);
}